

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O1

void wheel_torque(OdometryPtr odm,SpurUserParamsPtr spur,double *torque)

{
  ParametersPtr p_Var1;
  long lVar2;
  double dVar3;
  
  lVar2 = 0;
  p_Var1 = get_param_ptr();
  do {
    if (p_Var1->motor_enable[lVar2] != 0) {
      dVar3 = p(YP_PARAM_VEHICLE_CONTROL,(motor_id)lVar2);
      if (0.0 < dVar3) {
        torque[lVar2] = spur->torque[lVar2] + torque[lVar2];
        spur->wheel_mode[lVar2] = MOTOR_CONTROL_FREE;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void wheel_torque(OdometryPtr odm, SpurUserParamsPtr spur, double* torque)
{
  int i;
  ParametersPtr param;
  param = get_param_ptr();

  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!param->motor_enable[i])
      continue;

    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
    {
      torque[i] += spur->torque[i];
      spur->wheel_mode[i] = MOTOR_CONTROL_FREE;
    }
  }
}